

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void pobr::utils::Logger::notice(string *message)

{
  allocator local_91;
  string local_90;
  uint local_70;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  string *local_10;
  string *message_local;
  
  local_10 = message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Note",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"cyan",&local_69);
  TerminalPrinter::printLabel(&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"Note",&local_91);
  local_70 = TerminalPrinter::getLabelLength(&local_90);
  print(&local_70,local_10);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

void Logger::notice(const std::string& message)
{
    Logger::printLabel("Note", "cyan");
    Logger::print(Logger::getLabelLength("Note"), message);
}